

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

void AccumulateRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int rgb_stride,
                   uint16_t *dst,int width)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  int iVar4;
  long lVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint32_t uVar8;
  long lVar9;
  ulong uVar10;
  undefined2 local_a4;
  
  lVar9 = (long)rgb_stride;
  lVar5 = (long)(rgb_stride + 4);
  uVar10 = 0;
  uVar7 = (ulong)(uint)(width >> 1);
  if (width >> 1 < 1) {
    uVar7 = uVar10;
  }
  while (iVar4 = (int)uVar7, uVar7 = (ulong)(iVar4 - 1), iVar4 != 0) {
    uVar8 = (uint)a_ptr[uVar10 + lVar9 + 4] + (uint)a_ptr[uVar10 + 4] +
            (uint)a_ptr[uVar10 + lVar9] + (uint)a_ptr[uVar10];
    if ((uVar8 == 0x3fc) || (uVar8 == 0)) {
      iVar4 = LinearToGamma((uint)kGammaToLinearTab[r_ptr[uVar10 + lVar5]] +
                            (uint)kGammaToLinearTab[r_ptr[uVar10 + lVar9]] +
                            (uint)kGammaToLinearTab[r_ptr[uVar10 + 4]] +
                            (uint)kGammaToLinearTab[r_ptr[uVar10]],0);
      local_a4 = (undefined2)iVar4;
      iVar4 = LinearToGamma((uint)kGammaToLinearTab[g_ptr[uVar10 + lVar5]] +
                            (uint)kGammaToLinearTab[g_ptr[uVar10 + lVar9]] +
                            (uint)kGammaToLinearTab[g_ptr[uVar10 + 4]] +
                            (uint)kGammaToLinearTab[g_ptr[uVar10]],0);
      uVar1 = (undefined2)iVar4;
      iVar4 = LinearToGamma((uint)kGammaToLinearTab[b_ptr[uVar10 + lVar5]] +
                            (uint)kGammaToLinearTab[b_ptr[uVar10 + lVar9]] +
                            (uint)kGammaToLinearTab[b_ptr[uVar10 + 4]] +
                            (uint)kGammaToLinearTab[b_ptr[uVar10]],0);
      uVar2 = (undefined2)iVar4;
    }
    else {
      puVar6 = a_ptr + uVar10;
      iVar4 = LinearToGammaWeighted(r_ptr + uVar10,puVar6,uVar8,4,rgb_stride);
      local_a4 = (undefined2)iVar4;
      iVar4 = LinearToGammaWeighted(g_ptr + uVar10,puVar6,uVar8,4,rgb_stride);
      uVar1 = (undefined2)iVar4;
      iVar4 = LinearToGammaWeighted(b_ptr + uVar10,puVar6,uVar8,4,rgb_stride);
      uVar2 = (undefined2)iVar4;
    }
    *(undefined2 *)((long)dst + uVar10) = local_a4;
    *(undefined2 *)((long)dst + uVar10 + 2) = uVar1;
    *(undefined2 *)((long)dst + uVar10 + 4) = uVar2;
    *(short *)((long)dst + uVar10 + 6) = (short)uVar8;
    uVar10 = uVar10 + 8;
  }
  if ((width & 1U) != 0) {
    uVar7 = uVar10 & 0xffffffff;
    puVar6 = a_ptr + uVar7;
    iVar4 = (uint)puVar6[lVar9] + (uint)a_ptr[uVar7];
    uVar8 = iVar4 * 2;
    if ((iVar4 == 0x1fe) || (iVar4 == 0)) {
      iVar4 = LinearToGamma((uint)kGammaToLinearTab[r_ptr[lVar9 + uVar7]] +
                            (uint)kGammaToLinearTab[r_ptr[uVar7]],1);
      uVar2 = (undefined2)iVar4;
      iVar4 = LinearToGamma((uint)kGammaToLinearTab[g_ptr[lVar9 + uVar7]] +
                            (uint)kGammaToLinearTab[g_ptr[uVar7]],1);
      uVar1 = (undefined2)iVar4;
      iVar4 = LinearToGamma((uint)kGammaToLinearTab[b_ptr[lVar9 + uVar7]] +
                            (uint)kGammaToLinearTab[b_ptr[uVar7]],1);
      uVar3 = (undefined2)iVar4;
    }
    else {
      iVar4 = LinearToGammaWeighted(r_ptr + uVar7,puVar6,uVar8,0,rgb_stride);
      uVar2 = (undefined2)iVar4;
      iVar4 = LinearToGammaWeighted(g_ptr + uVar7,puVar6,uVar8,0,rgb_stride);
      uVar1 = (undefined2)iVar4;
      iVar4 = LinearToGammaWeighted(b_ptr + uVar7,puVar6,uVar8,0,rgb_stride);
      uVar3 = (undefined2)iVar4;
    }
    *(undefined2 *)((long)dst + uVar10) = uVar2;
    *(undefined2 *)((long)dst + uVar10 + 2) = uVar1;
    *(undefined2 *)((long)dst + uVar10 + 4) = uVar3;
    *(short *)((long)dst + uVar10 + 6) = (short)uVar8;
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGBA(const uint8_t* const r_ptr,
                                       const uint8_t* const g_ptr,
                                       const uint8_t* const b_ptr,
                                       const uint8_t* const a_ptr,
                                       int rgb_stride,
                                       uint16_t* dst, int width) {
  int i, j;
  // we loop over 2x2 blocks and produce one R/G/B/A value for each.
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * 4, dst += 4) {
    const uint32_t a = SUM4ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM4(r_ptr + j, 4);
      g = SUM4(g_ptr + j, 4);
      b = SUM4(b_ptr + j, 4);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 4, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 4, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 4, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
  if (width & 1) {
    const uint32_t a = 2u * SUM2ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM2(r_ptr + j);
      g = SUM2(g_ptr + j);
      b = SUM2(b_ptr + j);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 0, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 0, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 0, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
}